

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalGetThreadDataFromHandle
                    (CPalThread *pThread,HANDLE hThread,DWORD dwRightsRequired,
                    CPalThread **ppTargetThread,IPalObject **ppobjThread)

{
  undefined8 *local_50;
  CThreadProcessLocalData *pData;
  IDataLock *pLock;
  IPalObject *pobj;
  IPalObject **ppIStack_30;
  PAL_ERROR palError;
  IPalObject **ppobjThread_local;
  CPalThread **ppTargetThread_local;
  HANDLE pVStack_18;
  DWORD dwRightsRequired_local;
  HANDLE hThread_local;
  CPalThread *pThread_local;
  
  pobj._4_4_ = 0;
  *ppobjThread = (IPalObject *)0x0;
  if ((undefined1 *)hThread == &DAT_ffffff03) {
    *ppTargetThread = pThread;
  }
  else {
    ppIStack_30 = ppobjThread;
    ppobjThread_local = (IPalObject **)ppTargetThread;
    ppTargetThread_local._4_4_ = dwRightsRequired;
    pVStack_18 = hThread;
    hThread_local = pThread;
    pobj._4_4_ = (**(code **)(*g_pObjectManager + 0x28))
                           (g_pObjectManager,pThread,hThread,&aotThread,dwRightsRequired,&pLock);
    if (pobj._4_4_ == 0) {
      pobj._4_4_ = (*pLock->_vptr_IDataLock[3])(pLock,hThread_local,0,&pData,&local_50);
      if (pobj._4_4_ == 0) {
        *ppobjThread_local = (IPalObject *)*local_50;
        (*(code *)pData->pThread->_vptr_CPalThread)(pData,hThread_local,0);
        *ppIStack_30 = (IPalObject *)pLock;
      }
      else {
        (*pLock->_vptr_IDataLock[8])(pLock,hThread_local);
      }
    }
  }
  return pobj._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetThreadDataFromHandle(
    CPalThread *pThread,
    HANDLE hThread,
    DWORD dwRightsRequired,
    CPalThread **ppTargetThread,
    IPalObject **ppobjThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj;
    IDataLock *pLock;
    CThreadProcessLocalData *pData;

    *ppobjThread = NULL;

    if (hPseudoCurrentThread == hThread)
    {
        *ppTargetThread = pThread;
    }
    else
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hThread,
            &aotThread,
            dwRightsRequired,
            &pobj
            );

        if (NO_ERROR == palError)
        {
            palError = pobj->GetProcessLocalData(
                pThread,
                ReadLock,
                &pLock,
                reinterpret_cast<void**>(&pData)
                );

            if (NO_ERROR == palError)
            {
                *ppTargetThread = pData->pThread;
                pLock->ReleaseLock(pThread, FALSE);

                //
                // Transfer object reference to out param
                //

                *ppobjThread = pobj;
            }
            else
            {
                pobj->ReleaseReference(pThread);
            }
        }
    }

    return palError;
}